

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  bool bVar1;
  string local_68;
  TimeInMillis local_48;
  String local_40;
  String local_30;
  
  bVar1 = TestCase::Passed(test_case);
  local_48 = test_case->elapsed_time_;
  StreamableToString<long_long>((internal *)&local_40,&local_48);
  String::Format(&local_30,"event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
                 local_40.c_str_);
  String::operator_cast_to_string(&local_68,&local_30);
  Send(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  String::~String(&local_30);
  String::~String(&local_40);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    Send(String::Format("event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                        test_case.Passed(),
                        StreamableToString(test_case.elapsed_time()).c_str()));
  }